

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O1

bool tcu::anon_unknown_0::comparePixelRGBA8
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,RGBA threshold,
               int x,int y)

{
  RGBA a;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  RGBA b;
  undefined4 in_register_0000000c;
  uint uVar4;
  deUint32 v;
  int iVar5;
  ulong uVar6;
  deUint32 u;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 in_register_00000084;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  RGBA local_4c;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_48 = CONCAT44(in_register_00000084,y);
  local_38 = CONCAT44(in_register_0000000c,x);
  local_40 = (ulong)(uint)(x * 4);
  iVar14 = x + -1;
  if (x + -1 < 1) {
    iVar14 = 0;
  }
  iVar5 = (reference->m_size).m_data[0] + -1;
  if (x + 1 < iVar5) {
    iVar5 = x + 1;
  }
  iVar15 = 0;
  if (0 < y + -1) {
    iVar15 = y + -1;
  }
  iVar17 = (reference->m_size).m_data[1] + -1;
  if (y + 1 < iVar17) {
    iVar17 = y + 1;
  }
  a.m_value = *(deUint32 *)
               ((long)result->m_data + local_40 + (uint)((result->m_pitch).m_data[1] * y));
  uVar1 = *(uint *)((long)reference->m_data + local_40 + (uint)((reference->m_pitch).m_data[1] * y))
  ;
  if (a.m_value != uVar1) {
    uVar7 = (a.m_value & 0xff) - (uVar1 & 0xff);
    uVar2 = -uVar7;
    if (0 < (int)uVar7) {
      uVar2 = uVar7;
    }
    uVar7 = a.m_value >> 8;
    iVar8 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
    iVar13 = -iVar8;
    if (0 < iVar8) {
      iVar13 = iVar8;
    }
    uVar9 = a.m_value >> 0x10;
    iVar10 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
    iVar8 = -iVar10;
    if (0 < iVar10) {
      iVar8 = iVar10;
    }
    uVar11 = a.m_value >> 0x18;
    iVar12 = uVar11 - (uVar1 >> 0x18);
    iVar10 = -iVar12;
    if (0 < iVar12) {
      iVar10 = iVar12;
    }
    local_4c.m_value = iVar8 << 0x10 | iVar13 << 8 | iVar10 << 0x18 | uVar2;
    bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
    if (!bVar3) {
      uVar16 = (ulong)(uint)(iVar14 << 2);
      uVar1 = *(uint *)((long)reference->m_data +
                       uVar16 + (uint)((reference->m_pitch).m_data[1] * (int)local_48));
      if (a.m_value != uVar1) {
        uVar4 = (a.m_value & 0xff) - (uVar1 & 0xff);
        uVar2 = -uVar4;
        if (0 < (int)uVar4) {
          uVar2 = uVar4;
        }
        iVar13 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
        iVar14 = -iVar13;
        if (0 < iVar13) {
          iVar14 = iVar13;
        }
        iVar8 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
        iVar13 = -iVar8;
        if (0 < iVar8) {
          iVar13 = iVar8;
        }
        iVar10 = uVar11 - (uVar1 >> 0x18);
        iVar8 = -iVar10;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        local_4c.m_value = iVar13 << 0x10 | iVar14 << 8 | iVar8 << 0x18 | uVar2;
        bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
        if (!bVar3) {
          uVar6 = (ulong)(uint)(iVar5 << 2);
          uVar1 = *(uint *)((long)reference->m_data +
                           uVar6 + (uint)((reference->m_pitch).m_data[1] * (int)local_48));
          if (a.m_value != uVar1) {
            uVar4 = (a.m_value & 0xff) - (uVar1 & 0xff);
            uVar2 = -uVar4;
            if (0 < (int)uVar4) {
              uVar2 = uVar4;
            }
            iVar5 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
            iVar14 = -iVar5;
            if (0 < iVar5) {
              iVar14 = iVar5;
            }
            iVar13 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
            iVar5 = -iVar13;
            if (0 < iVar13) {
              iVar5 = iVar13;
            }
            iVar8 = uVar11 - (uVar1 >> 0x18);
            iVar13 = -iVar8;
            if (0 < iVar8) {
              iVar13 = iVar8;
            }
            local_4c.m_value = iVar5 << 0x10 | iVar14 << 8 | iVar13 << 0x18 | uVar2;
            bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
            if ((!bVar3) &&
               (uVar1 = *(uint *)((long)reference->m_data +
                                 uVar16 + (uint)((reference->m_pitch).m_data[1] * iVar15)),
               a.m_value != uVar1)) {
              uVar4 = (a.m_value & 0xff) - (uVar1 & 0xff);
              uVar2 = -uVar4;
              if (0 < (int)uVar4) {
                uVar2 = uVar4;
              }
              iVar5 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
              iVar14 = -iVar5;
              if (0 < iVar5) {
                iVar14 = iVar5;
              }
              iVar13 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
              iVar5 = -iVar13;
              if (0 < iVar13) {
                iVar5 = iVar13;
              }
              iVar8 = uVar11 - (uVar1 >> 0x18);
              iVar13 = -iVar8;
              if (0 < iVar8) {
                iVar13 = iVar8;
              }
              local_4c.m_value = iVar5 << 0x10 | iVar14 << 8 | iVar13 << 0x18 | uVar2;
              bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
              if ((!bVar3) &&
                 (uVar1 = *(uint *)((long)reference->m_data +
                                   local_40 + (uint)((reference->m_pitch).m_data[1] * iVar15)),
                 a.m_value != uVar1)) {
                uVar4 = (a.m_value & 0xff) - (uVar1 & 0xff);
                uVar2 = -uVar4;
                if (0 < (int)uVar4) {
                  uVar2 = uVar4;
                }
                iVar5 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
                iVar14 = -iVar5;
                if (0 < iVar5) {
                  iVar14 = iVar5;
                }
                iVar13 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
                iVar5 = -iVar13;
                if (0 < iVar13) {
                  iVar5 = iVar13;
                }
                iVar8 = uVar11 - (uVar1 >> 0x18);
                iVar13 = -iVar8;
                if (0 < iVar8) {
                  iVar13 = iVar8;
                }
                local_4c.m_value = iVar5 << 0x10 | iVar14 << 8 | iVar13 << 0x18 | uVar2;
                bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
                if ((!bVar3) &&
                   (uVar1 = *(uint *)((long)reference->m_data +
                                     uVar6 + (uint)(iVar15 * (reference->m_pitch).m_data[1])),
                   a.m_value != uVar1)) {
                  uVar4 = (a.m_value & 0xff) - (uVar1 & 0xff);
                  uVar2 = -uVar4;
                  if (0 < (int)uVar4) {
                    uVar2 = uVar4;
                  }
                  iVar5 = (uVar7 & 0xff) - (uVar1 >> 8 & 0xff);
                  iVar14 = -iVar5;
                  if (0 < iVar5) {
                    iVar14 = iVar5;
                  }
                  iVar15 = (uVar9 & 0xff) - (uVar1 >> 0x10 & 0xff);
                  iVar5 = -iVar15;
                  if (0 < iVar15) {
                    iVar5 = iVar15;
                  }
                  iVar13 = uVar11 - (uVar1 >> 0x18);
                  iVar15 = -iVar13;
                  if (0 < iVar13) {
                    iVar15 = iVar13;
                  }
                  local_4c.m_value = iVar5 << 0x10 | iVar14 << 8 | iVar15 << 0x18 | uVar2;
                  bVar3 = RGBA::isBelowThreshold(&local_4c,threshold);
                  if (((!bVar3) &&
                      (bVar3 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                         ((long)reference->m_data +
                                                         uVar16 + (uint)((reference->m_pitch).m_data
                                                                         [1] * iVar17)),threshold),
                      !bVar3)) &&
                     (bVar3 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                        ((long)reference->m_data +
                                                        local_40 +
                                                        (uint)((reference->m_pitch).m_data[1] *
                                                              iVar17)),threshold), !bVar3)) {
                    bVar3 = compareThreshold(a,(RGBA)*(deUint32 *)
                                                      ((long)reference->m_data +
                                                      uVar6 + (uint)(iVar17 * (reference->m_pitch).
                                                                              m_data[1])),threshold)
                    ;
                    bVar18 = true;
                    if (bVar3) {
                      return true;
                    }
                    iVar14 = (int)local_38;
                    iVar5 = (int)local_48;
                    uVar16 = 0;
                    while( true ) {
                      u = comparePixelRGBA8::s_offsets[uVar16][0] + iVar14 * 0x100 + -0x100;
                      bVar3 = false;
                      if (((-1 < (int)u) &&
                          ((int)u < (reference->m_size).m_data[0] * 0x100 + -0x100)) &&
                         ((v = comparePixelRGBA8::s_offsets[uVar16][1] + iVar5 * 0x100 + -0x100,
                          -1 < (int)v && ((int)v < (reference->m_size).m_data[1] * 0x100 + -0x100)))
                         ) {
                        b = bilinearSampleRGBA8(reference,u,v);
                        bVar3 = compareThreshold(a,b,threshold);
                      }
                      if (bVar3 != false) break;
                      bVar18 = uVar16 < 0x1b;
                      uVar16 = uVar16 + 1;
                      if (uVar16 == 0x1c) {
                        return bVar18;
                      }
                    }
                    return bVar18;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool comparePixelRGBA8 (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, int x, int y)
{
	const RGBA resPix = readRGBA8(result, (deUint32)x, (deUint32)y);

	// Step 1: Compare result pixel to 3x3 neighborhood pixels in reference.
	{
		const deUint32	x0		= (deUint32)de::max(x-1, 0);
		const deUint32	x1		= (deUint32)x;
		const deUint32	x2		= (deUint32)de::min(x+1, reference.getWidth()-1);
		const deUint32	y0		= (deUint32)de::max(y-1, 0);
		const deUint32	y1		= (deUint32)y;
		const deUint32	y2		= (deUint32)de::min(y+1, reference.getHeight()-1);

		if (compareThreshold(resPix, readRGBA8(reference, x1, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y2), threshold))
			return true;
	}

	// Step 2: Compare using bilinear sampling.
	{
		// \todo [pyry] Optimize sample positions!
		static const deUint32 s_offsets[][2] =
		{
			{ 226, 186 },
			{ 335, 235 },
			{ 279, 334 },
			{ 178, 272 },
			{ 112, 202 },
			{ 306, 117 },
			{ 396, 299 },
			{ 206, 382 },
			{ 146,  96 },
			{ 423, 155 },
			{ 361, 412 },
			{  84, 339 },
			{  48, 130 },
			{ 367,  43 },
			{ 455, 367 },
			{ 105, 439 },
			{  83,  46 },
			{ 217,  24 },
			{ 461,  71 },
			{ 450, 459 },
			{ 239, 469 },
			{  67, 267 },
			{ 459, 255 },
			{  13, 416 },
			{  10, 192 },
			{ 141, 502 },
			{ 503, 304 },
			{ 380, 506 }
		};

		for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(s_offsets); sampleNdx++)
		{
			const int u = (x<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][0] - (1<<NUM_SUBPIXEL_BITS);
			const int v = (y<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][1] - (1<<NUM_SUBPIXEL_BITS);

			if (!de::inBounds(u, 0, (reference.getWidth()-1)<<NUM_SUBPIXEL_BITS) ||
				!de::inBounds(v, 0, (reference.getHeight()-1)<<NUM_SUBPIXEL_BITS))
				continue;

			if (compareThreshold(resPix, bilinearSampleRGBA8(reference, (deUint32)u, (deUint32)v), threshold))
				return true;
		}
	}

	return false;
}